

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageOperators.cpp
# Opt level: O0

unique_ptr<helics::Message,_std::default_delete<helics::Message>_> __thiscall
helics::MessageDestOperator::process
          (MessageDestOperator *this,
          unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *message)

{
  bool bVar1;
  pointer pMVar2;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_RDX;
  long in_RSI;
  __uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true> in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  bVar1 = std::function::operator_cast_to_bool
                    ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)0x37f708);
  if (bVar1) {
    CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
              ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x37f71b);
    bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x37f72a);
    if (bVar1) {
      pMVar2 = CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::
               operator->((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                          0x37f73a);
      in_stack_ffffffffffffffa0 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pMVar2->dest;
      CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
                ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x37f74d);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    }
    in_stack_ffffffffffffff90 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RSI + 8);
    pMVar2 = CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::
             operator->((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                        0x37f779);
    __args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pMVar2->source;
    CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
              ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x37f78e);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator()(in_RDX,in_stack_ffffffffffffffa0,__args_1);
    CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
              ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x37f7b3);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    std::__cxx11::string::~string(in_stack_ffffffffffffff90);
  }
  CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::unique_ptr
            ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
             in_stack_ffffffffffffff90,
             (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
             in_stack_ffffffffffffff88);
  return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
         (tuple<helics::Message_*,_std::default_delete<helics::Message>_>)
         in_RDI.super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
         super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
         super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<Message> MessageDestOperator::process(std::unique_ptr<Message> message)
{
    if (DestUpdateFunction) {
        if (message->original_dest.empty()) {
            message->original_dest = message->dest;
        }
        message->dest = DestUpdateFunction(message->source, message->dest);
    }
    return message;
}